

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void gl4cts::CopyImage::Utils::writeChannel
               (GLenum type,GLuint channel,GLdouble value,GLubyte *pixel)

{
  TestError *this;
  double dVar1;
  
  switch(type) {
  case 0x1400:
    dVar1 = value * 127.0;
    goto LAB_009453f1;
  case 0x1401:
    dVar1 = value * 255.0;
LAB_009453f1:
    pixel[channel] = (GLubyte)(int)dVar1;
    break;
  case 0x1402:
    dVar1 = value * 32767.0;
    goto LAB_0094540e;
  case 0x1403:
    dVar1 = value * 65535.0;
LAB_0094540e:
    *(short *)(pixel + (ulong)channel * 2) = (short)(int)dVar1;
    break;
  case 0x1404:
    *(int *)(pixel + (ulong)channel * 4) = (int)(value * 2147483647.0);
    break;
  case 0x1405:
    *(int *)(pixel + (ulong)channel * 4) = (int)(long)(value * 4294967295.0);
    break;
  case 0x1406:
    *(float *)(pixel + (ulong)channel * 4) = (float)value;
    break;
  case 0x140b:
    writeBaseTypeToHalfFloatChannel(channel,value,pixel);
    return;
  default:
    if (type == 0x8032) {
      write3Channel<unsigned_char,3u,3u,2u,5u,2u,0u>(channel,value,pixel);
      return;
    }
    if (type == 0x8033) {
      write4Channel<unsigned_short,4u,4u,4u,4u,12u,8u,4u,0u>(channel,value,pixel);
      return;
    }
    if (type == 0x8034) {
      write4Channel<unsigned_short,5u,5u,5u,1u,11u,6u,1u,0u>(channel,value,pixel);
      return;
    }
    if (type == 0x8363) {
      write3Channel<unsigned_short,5u,6u,5u,11u,5u,0u>(channel,value,pixel);
      return;
    }
    if (type == 0x8368) {
      write4Channel<unsigned_int,2u,10u,10u,10u,30u,20u,10u,0u>(3 - channel,value,pixel);
      return;
    }
    if (type == 0x8c3b) {
      write11F_11F_10F_Channel(channel,value,pixel);
      return;
    }
    if (type == 0x8c3e) {
      write4Channel<unsigned_int,5u,9u,9u,9u,27u,18u,9u,0u>(3 - channel,value,pixel);
      return;
    }
  case 0x1407:
  case 0x1408:
  case 0x1409:
  case 0x140a:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
               ,0x96b);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void Utils::writeChannel(GLenum type, GLuint channel, GLdouble value, GLubyte* pixel)
{
	switch (type)
	{
	/* Base types */
	case GL_UNSIGNED_BYTE:
		writeBaseTypeToUnsignedChannel<GLubyte>(channel, value, pixel);
		break;
	case GL_UNSIGNED_SHORT:
		writeBaseTypeToUnsignedChannel<GLushort>(channel, value, pixel);
		break;
	case GL_UNSIGNED_INT:
		writeBaseTypeToUnsignedChannel<GLuint>(channel, value, pixel);
		break;
	case GL_BYTE:
		writeBaseTypeToSignedChannel<GLbyte>(channel, value, pixel);
		break;
	case GL_SHORT:
		writeBaseTypeToSignedChannel<GLshort>(channel, value, pixel);
		break;
	case GL_INT:
		writeBaseTypeToSignedChannel<GLint>(channel, value, pixel);
		break;
	case GL_HALF_FLOAT:
		writeBaseTypeToHalfFloatChannel(channel, value, pixel);
		break;
	case GL_FLOAT:
		writeBaseTypeToFloatChannel(channel, value, pixel);
		break;

	/* Complicated */

	/* 3 channles */
	case GL_UNSIGNED_BYTE_3_3_2:
		write3Channel<GLubyte, 3, 3, 2, 5, 2, 0>(channel, value, pixel);
		break;
	case GL_UNSIGNED_SHORT_5_6_5:
		write3Channel<GLushort, 5, 6, 5, 11, 5, 0>(channel, value, pixel);
		break;

	/* 4 channels */
	case GL_UNSIGNED_SHORT_4_4_4_4:
		write4Channel<GLushort, 4, 4, 4, 4, 12, 8, 4, 0>(channel, value, pixel);
		break;
	case GL_UNSIGNED_SHORT_5_5_5_1:
		write4Channel<GLushort, 5, 5, 5, 1, 11, 6, 1, 0>(channel, value, pixel);
		break;
	case GL_UNSIGNED_INT_2_10_10_10_REV:
		write4Channel<GLuint, 2, 10, 10, 10, 30, 20, 10, 0>(3 - channel, value, pixel);
		break;
	case GL_UNSIGNED_INT_5_9_9_9_REV:
		write4Channel<GLuint, 5, 9, 9, 9, 27, 18, 9, 0>(3 - channel, value, pixel);
		break;

	/* R11F_G11F_B10F - uber complicated */
	case GL_UNSIGNED_INT_10F_11F_11F_REV:
		write11F_11F_10F_Channel(channel, value, pixel);
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}
}